

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

Color * __thiscall Color::confine(Color *this)

{
  Color *in_RDI;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  
  dVar1 = 1.0;
  if (this->b <= 1.0) {
    dVar1 = this->b;
  }
  dVar2 = 0.0;
  if (0.0 <= dVar1) {
    dVar2 = dVar1;
  }
  auVar3._0_8_ = this->r;
  auVar3._8_8_ = this->g;
  auVar3 = minpd(_DAT_001060c0,auVar3);
  auVar3 = maxpd(ZEXT816(0),auVar3);
  in_RDI->r = (double)auVar3._0_8_;
  in_RDI->g = (double)auVar3._8_8_;
  in_RDI->b = dVar2;
  return in_RDI;
}

Assistant:

Color Color::confine() const
{
    return Color(std::max(std::min(r, 1.0), 0.0), std::max(std::min(g, 1.0), 0.0), std::max(std::min(b, 1.0), 0.0));
}